

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_message_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::javanano::RepeatedMessageFieldGenerator::GenerateSerializationCode
          (RepeatedMessageFieldGenerator *this,Printer *printer)

{
  io::Printer::Print(printer,&this->variables_,
                     "if (this.$name$ != null && this.$name$.length > 0) {\n  for (int i = 0; i < this.$name$.length; i++) {\n    $type$ element = this.$name$[i];\n    if (element != null) {\n      output.write$group_or_message$($number$, element);\n    }\n  }\n}\n"
                    );
  return;
}

Assistant:

void RepeatedMessageFieldGenerator::
GenerateSerializationCode(io::Printer* printer) const {
  printer->Print(variables_,
    "if (this.$name$ != null && this.$name$.length > 0) {\n"
    "  for (int i = 0; i < this.$name$.length; i++) {\n"
    "    $type$ element = this.$name$[i];\n"
    "    if (element != null) {\n"
    "      output.write$group_or_message$($number$, element);\n"
    "    }\n"
    "  }\n"
    "}\n");
}